

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVstone_set_output_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  int iVar1;
  CMFormat p_Var2;
  CManager in_RDX;
  CMFormat f;
  int ret;
  EVstone_set_output_request *request;
  EV_int_response response;
  FMStructDescList in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  p_Var2 = CMlookup_format((CManager_conflict)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
  if (p_Var2 == (CMFormat)0x0) {
    p_Var2 = INT_CMregister_format
                       (in_RDX,(FMStructDescList)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  iVar1 = EVstone_set_output((CManager_conflict)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (EVstone)((ulong)p_Var2 >> 0x20),(int)p_Var2,0);
  CMwrite((CMConnection)CONCAT44(iVar1,*(undefined4 *)&in_RDX->transports),(CMFormat)in_RDX,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

static void
REVstone_set_output_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVstone_set_output_request *request = (EVstone_set_output_request *) data;
    int ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVstone_set_output(cm, request->stone, request->output_index, request->target_stone);
    response.ret = ret;;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}